

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

exr_result_t exr_write_header(exr_context_t ctxt)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  exr_priv_part_t p_Var2;
  exr_priv_part_t *pp_Var3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  exr_result_t eVar7;
  int32_t val;
  uint64_t uVar8;
  exr_context_t nonc;
  ulong uVar9;
  long lVar10;
  
  if (ctxt == (exr_context_t)0x0) {
    iVar6 = 2;
  }
  else {
    __mutex = &ctxt->mutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (ctxt->mode != '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar7 = (*ctxt->standard_error)(ctxt,8);
      return eVar7;
    }
    iVar6 = ctxt->num_parts;
    if (iVar6 == 0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar7 = (*ctxt->report_error)(ctxt,6,"No parts defined in file prior to writing data");
      return eVar7;
    }
    bVar4 = (int)(uint)(iVar6 < 2) < ctxt->num_parts;
    if ((int)(uint)(iVar6 < 2) < ctxt->num_parts) {
      uVar9 = (ulong)(iVar6 < 2);
      do {
        if (ctxt->parts[uVar9]->name == (exr_attribute_t *)0x0) {
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          iVar6 = (*ctxt->print_error)
                            (ctxt,3,"Part %d missing required name for multi-part file",
                             uVar9 & 0xffffffff);
          break;
        }
        uVar9 = uVar9 + 1;
        bVar4 = (long)uVar9 < (long)ctxt->num_parts;
      } while ((long)uVar9 < (long)ctxt->num_parts);
    }
    if (!bVar4) {
      bVar4 = true;
      if (ctxt->num_parts < 1) {
        eVar7 = 0;
      }
      else {
        lVar10 = 0;
        do {
          p_Var2 = ctxt->parts[lVar10];
          if (p_Var2->channels == (exr_attribute_t *)0x0) {
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            iVar6 = (*ctxt->print_error)(ctxt,0xd,"Part %d is missing channel list");
LAB_00119d70:
            bVar5 = false;
            bVar4 = false;
            eVar7 = 0;
          }
          else {
            bVar5 = false;
            eVar7 = internal_exr_compute_tile_information(ctxt,p_Var2,0);
            bVar4 = true;
            if (eVar7 == 0) {
              val = internal_exr_compute_chunk_offset_size(p_Var2);
              if (val < 0) {
                pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                iVar6 = (*ctxt->report_error)
                                  (ctxt,6,
                                   "Invalid part specification computing number of chunks in file");
                goto LAB_00119d70;
              }
              p_Var2->chunk_count = val;
              if ((ctxt->has_nonimage_data != '\0') || (ctxt->is_multipart != '\0')) {
                pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                eVar7 = exr_attr_set_int(ctxt,(int)lVar10,"chunkCount",val);
                pthread_mutex_lock((pthread_mutex_t *)__mutex);
                if (eVar7 != 0) {
                  bVar5 = false;
                  bVar4 = true;
                  goto LAB_00119d74;
                }
              }
              eVar7 = internal_exr_validate_write_part(ctxt,p_Var2);
              bVar5 = true;
              bVar4 = false;
            }
          }
LAB_00119d74:
          if (!bVar5) goto LAB_00119e31;
        } while ((eVar7 == 0) && (lVar10 = lVar10 + 1, lVar10 < ctxt->num_parts));
        bVar4 = true;
      }
LAB_00119e31:
      if (bVar4) {
        ctxt->output_file_offset = 0;
        iVar6 = eVar7;
        if (eVar7 == 0) {
          iVar6 = internal_exr_write_header(ctxt);
        }
        if (iVar6 == 0) {
          ctxt->mode = '\x03';
          ctxt->cur_output_part = 0;
          ctxt->last_output_chunk = -1;
          ctxt->output_chunk_count = 0;
          iVar1 = ctxt->num_parts;
          if (0 < (long)iVar1) {
            uVar8 = ctxt->output_file_offset;
            pp_Var3 = ctxt->parts;
            lVar10 = 0;
            do {
              p_Var2 = pp_Var3[lVar10];
              p_Var2->chunk_table_offset = uVar8;
              uVar8 = uVar8 + (long)p_Var2->chunk_count * 8;
              lVar10 = lVar10 + 1;
            } while (iVar1 != lVar10);
            ctxt->output_file_offset = uVar8;
          }
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
    }
  }
  return iVar6;
}

Assistant:

exr_result_t
exr_write_header (exr_context_t ctxt)
{
    exr_result_t rv = EXR_ERR_SUCCESS;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;
    internal_exr_lock (ctxt);

    if (ctxt->mode != EXR_CONTEXT_WRITE)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));

    if (ctxt->num_parts == 0)
        return EXR_UNLOCK_AND_RETURN (ctxt->report_error (
            ctxt,
            EXR_ERR_FILE_BAD_HEADER,
            "No parts defined in file prior to writing data"));

    /* add part and set name should have already validated the uniqueness
     * so just ensure the name has been set for multi part files
     */
    for ( int p = ctxt->num_parts > 1 ? 0 : 1; p < ctxt->num_parts; ++p )
    {
        const exr_attribute_t* pname = ctxt->parts[p]->name;
        if (!pname)
        {
            return EXR_UNLOCK_AND_RETURN (
                ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Part %d missing required name for multi-part file",
                    p));
        }
    }

    for (int p = 0; rv == EXR_ERR_SUCCESS && p < ctxt->num_parts; ++p)
    {
        exr_priv_part_t curp = ctxt->parts[p];

        int32_t ccount = 0;

        if (!curp->channels)
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_MISSING_REQ_ATTR,
                "Part %d is missing channel list",
                p));

        rv = internal_exr_compute_tile_information (ctxt, curp, 0);
        if (rv != EXR_ERR_SUCCESS) break;

        ccount = internal_exr_compute_chunk_offset_size (curp);
        if (ccount < 0)
            return EXR_UNLOCK_AND_RETURN (
                ctxt->report_error (
                    ctxt,
                    EXR_ERR_FILE_BAD_HEADER,
                    "Invalid part specification computing number of chunks in file"));

        curp->chunk_count = ccount;

        if (ctxt->has_nonimage_data || ctxt->is_multipart)
        {
            internal_exr_unlock (ctxt);
            rv = exr_attr_set_int (ctxt, p, EXR_REQ_CHUNK_COUNT_STR, ccount);
            internal_exr_lock (ctxt);
            if (rv != EXR_ERR_SUCCESS) break;
        }

        rv = internal_exr_validate_write_part (ctxt, curp);
    }

    ctxt->output_file_offset = 0;

    if (rv == EXR_ERR_SUCCESS) rv = internal_exr_write_header (ctxt);

    if (rv == EXR_ERR_SUCCESS)
    {
        ctxt->mode               = EXR_CONTEXT_WRITING_DATA;
        ctxt->cur_output_part    = 0;
        ctxt->last_output_chunk  = -1;
        ctxt->output_chunk_count = 0;
        for (int p = 0; rv == EXR_ERR_SUCCESS && p < ctxt->num_parts; ++p)
        {
            exr_priv_part_t curp = ctxt->parts[p];

            curp->chunk_table_offset = ctxt->output_file_offset;
            ctxt->output_file_offset +=
                (uint64_t) (curp->chunk_count) * sizeof (uint64_t);
        }
    }

    return EXR_UNLOCK_AND_RETURN (rv);
}